

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void do_repeat_this_proc(Am_Object *cmd)

{
  Am_Handler_Selective_Undo_Method_Type *pAVar1;
  bool bVar2;
  Am_Value *value;
  Am_Object undo_handler;
  Am_Object command_to_undo;
  Am_Object new_cmd;
  Am_Handler_Selective_Undo_Method method;
  Am_Object AStack_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Handler_Selective_Undo_Method local_28;
  
  Am_Object::Am_Object(&local_30,cmd);
  get_command_to_undo(&local_40);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_48,cmd);
  get_undo_handler(&AStack_68);
  Am_Object::~Am_Object(&local_48);
  bVar2 = Am_Object::Valid(&local_40);
  if (bVar2) {
    local_28.from_wrapper = (Am_Method_Wrapper *)0x0;
    local_28.Call = (Am_Handler_Selective_Undo_Method_Type *)0x0;
    value = Am_Object::Get(&AStack_68,0x149,0);
    Am_Handler_Selective_Undo_Method::operator=(&local_28,value);
    pAVar1 = local_28.Call;
    if (local_28.Call != (Am_Handler_Selective_Undo_Method_Type *)0x0) {
      Am_Object::Am_Object(&local_50,&AStack_68);
      Am_Object::Am_Object(&local_58,&local_40);
      (*pAVar1)((Am_Object_Data *)&local_38,(Am_Object_Data *)&local_50);
      Am_Object::~Am_Object(&local_58);
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&local_38);
    }
  }
  Am_Object::Am_Object(&local_60,cmd);
  mark_changed_command_to_undo(&local_60);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&AStack_68);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_repeat_this, (Am_Object cmd))
{
  Am_Object command_to_undo = get_command_to_undo(cmd);
  Am_Object undo_handler = get_undo_handler(cmd);
  if (command_to_undo.Valid()) {
    Am_Handler_Selective_Undo_Method method;
    method = undo_handler.Get(Am_SELECTIVE_REPEAT_SAME_METHOD);
    if (method.Valid()) {
      Am_Object new_cmd = method.Call(undo_handler, command_to_undo);
    }
  }
  mark_changed_command_to_undo(cmd);
}